

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_file_stat
                  (mz_zip_archive *pZip,mz_uint file_index,mz_zip_archive_file_stat *pStat)

{
  mz_bool mVar1;
  mz_bool *in_stack_00000010;
  undefined4 in_stack_00000020;
  mz_zip_archive *in_stack_00000030;
  
  mVar1 = mz_zip_file_stat_internal
                    (in_stack_00000030,pZip._4_4_,(mz_uint8 *)CONCAT44(file_index,in_stack_00000020)
                     ,pStat,in_stack_00000010);
  return mVar1;
}

Assistant:

mz_bool mz_zip_reader_file_stat(mz_zip_archive *pZip, mz_uint file_index,
                                mz_zip_archive_file_stat *pStat) {
  return mz_zip_file_stat_internal(
      pZip, file_index, mz_zip_get_cdh(pZip, file_index), pStat, NULL);
}